

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

void __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<true>_>::clock_envelope
          (fm_operator<ymfm::opn_registers_base<true>_> *this,uint32_t env_counter)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  uint16_t uVar5;
  uint uVar6;
  envelope_state eVar7;
  
  eVar7 = this->m_env_state;
  uVar4 = this->m_env_attenuation;
  if (uVar4 == 0 && eVar7 == EG_ATTACK) {
    this->m_env_state = EG_DECAY;
LAB_001780c7:
    if ((uint)uVar4 < (this->m_cache).eg_sustain) {
      eVar7 = EG_DECAY;
    }
    else {
      this->m_env_state = EG_SUSTAIN;
      eVar7 = EG_SUSTAIN;
    }
  }
  else if (eVar7 == EG_DECAY) goto LAB_001780c7;
  bVar1 = (this->m_cache).eg_rate[eVar7];
  bVar2 = bVar1 >> 2;
  uVar6 = env_counter << (bVar2 & 0x1f);
  if ((uVar6 & 0x7ff) == 0) {
    if (bVar1 < 0x30) {
      bVar2 = 0xb;
    }
    uVar6 = *(uint *)(attenuation_increment(unsigned_int,unsigned_int)::s_increment_table +
                     (ulong)bVar1 * 4) >> ((byte)((uVar6 >> (bVar2 & 0x1f)) << 2) & 0x1f) & 0xf;
    if (eVar7 == EG_ATTACK) {
      if (bVar1 < 0x3e) {
        uVar5 = uVar4 + (short)(uVar6 * ~(uint)uVar4 >> 4);
LAB_00178168:
        this->m_env_attenuation = uVar5;
        return;
      }
    }
    else {
      sVar3 = (short)uVar6;
      if ((this->m_regs->m_regdata[this->m_opoffs + 0x90] & 8) == 0) {
        uVar4 = uVar4 + sVar3;
        this->m_env_attenuation = uVar4;
      }
      else if (uVar4 < 0x200) {
        uVar5 = uVar4 + sVar3 * 4;
        goto LAB_00178168;
      }
      uVar5 = 0x3ff;
      if (0x3ff < uVar4) goto LAB_00178168;
    }
  }
  return;
}

Assistant:

void fm_operator<RegisterType>::clock_envelope(uint32_t env_counter)
{
	// handle attack->decay transitions
	if (m_env_state == EG_ATTACK && m_env_attenuation == 0)
		m_env_state = EG_DECAY;

	// handle decay->sustain transitions; it is important to do this immediately
	// after the attack->decay transition above in the event that the sustain level
	// is set to 0 (in which case we will skip right to sustain without doing any
	// decay); as an example where this can be heard, check the cymbals sound
	// in channel 0 of shinobi's test mode sound #5
	if (m_env_state == EG_DECAY && m_env_attenuation >= m_cache.eg_sustain)
		m_env_state = EG_SUSTAIN;

	// fetch the appropriate 6-bit rate value from the cache
	uint32_t rate = m_cache.eg_rate[m_env_state];

	// compute the rate shift value; this is the shift needed to
	// apply to the env_counter such that it becomes a 5.11 fixed
	// point number
	uint32_t rate_shift = rate >> 2;
	env_counter <<= rate_shift;

	// see if the fractional part is 0; if not, it's not time to clock
	if (bitfield(env_counter, 0, 11) != 0)
		return;

	// determine the increment based on the non-fractional part of env_counter
	uint32_t relevant_bits = bitfield(env_counter, (rate_shift <= 11) ? 11 : rate_shift, 3);
	uint32_t increment = attenuation_increment(rate, relevant_bits);

	// attack is the only one that increases
	if (m_env_state == EG_ATTACK)
	{
		// glitch means that attack rates of 62/63 don't increment if
		// changed after the initial key on (where they are handled
		// specially); nukeykt confirms this happens on OPM, OPN, OPL/OPLL
		// at least so assuming it is true for everyone
		if (rate < 62)
			m_env_attenuation += (~m_env_attenuation * increment) >> 4;
	}

	// all other cases are similar
	else
	{
		// non-SSG-EG cases just apply the increment
		if (!m_regs.op_ssg_eg_enable(m_opoffs))
			m_env_attenuation += increment;

		// SSG-EG only applies if less than mid-point, and then at 4x
		else if (m_env_attenuation < 0x200)
			m_env_attenuation += 4 * increment;

		// clamp the final attenuation
		if (m_env_attenuation >= 0x400)
			m_env_attenuation = 0x3ff;

		// transition from depress to attack
		if (RegisterType::EG_HAS_DEPRESS && m_env_state == EG_DEPRESS && m_env_attenuation >= 0x200)
			start_attack();

		// transition from release to reverb, should switch at -18dB
		if (RegisterType::EG_HAS_REVERB && m_env_state == EG_RELEASE && m_env_attenuation >= 0xc0)
			m_env_state = EG_REVERB;
	}
}